

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O0

size_t mpp_buffer_get_size_with_caller(MppBuffer buffer,char *caller)

{
  MppBufferImpl *p;
  char *caller_local;
  MppBuffer buffer_local;
  
  if (buffer == (MppBuffer)0x0) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_size invalid NULL input from %s\n",(char *)0x0,caller)
    ;
    buffer_local = (MppBuffer)0x0;
  }
  else {
    if (*(long *)((long)buffer + 0x88) == 0) {
      _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_size buffer %p ret zero size from %s\n",(char *)0x0,
                 buffer,caller);
    }
    buffer_local = *(MppBuffer *)((long)buffer + 0x88);
  }
  return (size_t)buffer_local;
}

Assistant:

size_t mpp_buffer_get_size_with_caller(MppBuffer buffer, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_get_size invalid NULL input from %s\n", caller);
        return 0;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    if (p->info.size == 0)
        mpp_err("mpp_buffer_get_size buffer %p ret zero size from %s\n", buffer, caller);

    return p->info.size;
}